

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialRigidBodyInertia * __thiscall
RigidBodyDynamics::Math::SpatialRigidBodyInertia::operator+
          (SpatialRigidBodyInertia *this,SpatialRigidBodyInertia *rbi)

{
  double *in_RDX;
  double *in_RSI;
  SpatialRigidBodyInertia *in_RDI;
  double *Ixx;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffff58;
  Vector3_t *in_stack_ffffffffffffff60;
  SpatialRigidBodyInertia *h;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff88;
  
  Ixx = (double *)(*in_RSI + *in_RDX);
  h = in_RDI;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_ffffffffffffff88,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI);
  Vector3_t::
  Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SpatialRigidBodyInertia
            ((SpatialRigidBodyInertia *)(in_RSI[8] + in_RDX[8]),in_RSI[9] + in_RDX[9],(Vector3d *)h,
             Ixx,&in_RDI->m,in_RSI,(double *)&stack0xffffffffffffff88,
             (double *)(in_RSI[6] + in_RDX[6]),(double *)(in_RSI[5] + in_RDX[5]));
  return h;
}

Assistant:

SpatialRigidBodyInertia operator+ (const SpatialRigidBodyInertia &rbi) {
		return SpatialRigidBodyInertia (
				m + rbi.m,
				h + rbi.h,
				Ixx + rbi.Ixx,
				Iyx + rbi.Iyx, Iyy + rbi.Iyy,
				Izx + rbi.Izx, Izy + rbi.Izy, Izz + rbi.Izz
				);
	}